

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O3

bool __thiscall CommandLineArguments::parse(CommandLineArguments *this,TestPlugin *plugin)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  char *parameterName;
  SimpleString argument;
  uint local_4c;
  SimpleString local_48;
  SimpleString local_40;
  TestPlugin *local_38;
  
  local_4c = 1;
  if (1 < this->ac_) {
    uVar3 = 1;
    local_38 = plugin;
    do {
      uVar1 = local_4c;
      SimpleString::SimpleString(&local_40,this->av_[(int)local_4c]);
      SimpleString::SimpleString(&local_48,"-v");
      bVar2 = operator==(&local_40,&local_48);
      SimpleString::~SimpleString(&local_48);
      if (bVar2) {
        this->verbose_ = true;
      }
      else {
        SimpleString::SimpleString(&local_48,"-c");
        bVar2 = operator==(&local_40,&local_48);
        SimpleString::~SimpleString(&local_48);
        if (bVar2) {
          this->color_ = true;
        }
        else {
          SimpleString::SimpleString(&local_48,"-p");
          bVar2 = operator==(&local_40,&local_48);
          SimpleString::~SimpleString(&local_48);
          if (bVar2) {
            this->runTestsAsSeperateProcess_ = true;
          }
          else {
            SimpleString::SimpleString(&local_48,"-lg");
            bVar2 = operator==(&local_40,&local_48);
            SimpleString::~SimpleString(&local_48);
            if (bVar2) {
              this->listTestGroupNames_ = true;
            }
            else {
              SimpleString::SimpleString(&local_48,"-ln");
              bVar2 = operator==(&local_40,&local_48);
              SimpleString::~SimpleString(&local_48);
              if (bVar2) {
                this->listTestGroupAndCaseNames_ = true;
              }
              else {
                SimpleString::SimpleString(&local_48,"-ri");
                bVar2 = operator==(&local_40,&local_48);
                SimpleString::~SimpleString(&local_48);
                if (bVar2) {
                  this->runIgnored_ = true;
                }
                else {
                  SimpleString::SimpleString(&local_48,"-r");
                  bVar2 = SimpleString::startsWith(&local_40,&local_48);
                  SimpleString::~SimpleString(&local_48);
                  if (bVar2) {
                    SetRepeatCount(this,this->ac_,this->av_,(int *)&local_4c);
                  }
                  else {
                    SimpleString::SimpleString(&local_48,"-g");
                    bVar2 = SimpleString::startsWith(&local_40,&local_48);
                    SimpleString::~SimpleString(&local_48);
                    if (bVar2) {
                      AddGroupFilter(this,this->ac_,this->av_,(int *)&local_4c);
                    }
                    else {
                      SimpleString::SimpleString(&local_48,"-sg");
                      bVar2 = SimpleString::startsWith(&local_40,&local_48);
                      SimpleString::~SimpleString(&local_48);
                      if (bVar2) {
                        AddStrictGroupFilter(this,this->ac_,this->av_,(int *)&local_4c);
                      }
                      else {
                        SimpleString::SimpleString(&local_48,"-xg");
                        bVar2 = SimpleString::startsWith(&local_40,&local_48);
                        SimpleString::~SimpleString(&local_48);
                        if (bVar2) {
                          AddExcludeGroupFilter(this,this->ac_,this->av_,(int *)&local_4c);
                        }
                        else {
                          SimpleString::SimpleString(&local_48,"-xsg");
                          bVar2 = SimpleString::startsWith(&local_40,&local_48);
                          SimpleString::~SimpleString(&local_48);
                          if (bVar2) {
                            AddExcludeStrictGroupFilter(this,this->ac_,this->av_,(int *)&local_4c);
                          }
                          else {
                            SimpleString::SimpleString(&local_48,"-n");
                            bVar2 = SimpleString::startsWith(&local_40,&local_48);
                            SimpleString::~SimpleString(&local_48);
                            if (bVar2) {
                              AddNameFilter(this,this->ac_,this->av_,(int *)&local_4c);
                            }
                            else {
                              SimpleString::SimpleString(&local_48,"-sn");
                              bVar2 = SimpleString::startsWith(&local_40,&local_48);
                              SimpleString::~SimpleString(&local_48);
                              if (bVar2) {
                                AddStrictNameFilter(this,this->ac_,this->av_,(int *)&local_4c);
                              }
                              else {
                                SimpleString::SimpleString(&local_48,"-xn");
                                bVar2 = SimpleString::startsWith(&local_40,&local_48);
                                SimpleString::~SimpleString(&local_48);
                                if (bVar2) {
                                  AddExcludeNameFilter(this,this->ac_,this->av_,(int *)&local_4c);
                                }
                                else {
                                  SimpleString::SimpleString(&local_48,"-xsn");
                                  bVar2 = SimpleString::startsWith(&local_40,&local_48);
                                  SimpleString::~SimpleString(&local_48);
                                  if (bVar2) {
                                    AddExcludeStrictNameFilter
                                              (this,this->ac_,this->av_,(int *)&local_4c);
                                  }
                                  else {
                                    SimpleString::SimpleString(&local_48,"TEST(");
                                    bVar2 = SimpleString::startsWith(&local_40,&local_48);
                                    SimpleString::~SimpleString(&local_48);
                                    parameterName = "TEST(";
                                    if (!bVar2) {
                                      SimpleString::SimpleString(&local_48,"IGNORE_TEST(");
                                      bVar2 = SimpleString::startsWith(&local_40,&local_48);
                                      SimpleString::~SimpleString(&local_48);
                                      parameterName = "IGNORE_TEST(";
                                      if (!bVar2) {
                                        SimpleString::SimpleString(&local_48,"-o");
                                        bVar2 = SimpleString::startsWith(&local_40,&local_48);
                                        SimpleString::~SimpleString(&local_48);
                                        if (bVar2) {
                                          bVar2 = SetOutputType(this,this->ac_,this->av_,
                                                                (int *)&local_4c);
                                          uVar3 = (uint)bVar2;
                                        }
                                        else {
                                          SimpleString::SimpleString(&local_48,"-p");
                                          bVar2 = SimpleString::startsWith(&local_40,&local_48);
                                          SimpleString::~SimpleString(&local_48);
                                          if (bVar2) {
                                            uVar3 = (*local_38->_vptr_TestPlugin[7])
                                                              (local_38,(ulong)(uint)this->ac_,
                                                               this->av_,(ulong)uVar1);
                                          }
                                          else {
                                            SimpleString::SimpleString(&local_48,"-k");
                                            bVar2 = SimpleString::startsWith(&local_40,&local_48);
                                            SimpleString::~SimpleString(&local_48);
                                            if (!bVar2) {
                                              SimpleString::~SimpleString(&local_40);
                                              return false;
                                            }
                                            SetPackageName(this,this->ac_,this->av_,(int *)&local_4c
                                                          );
                                          }
                                        }
                                        goto LAB_001ab403;
                                      }
                                    }
                                    AddTestToRunBasedOnVerboseOutput
                                              (this,this->ac_,this->av_,(int *)&local_4c,
                                               parameterName);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_001ab403:
      SimpleString::~SimpleString(&local_40);
      if ((uVar3 & 1) == 0) {
        return false;
      }
      local_4c = local_4c + 1;
    } while ((int)local_4c < this->ac_);
  }
  return true;
}

Assistant:

bool CommandLineArguments::parse(TestPlugin* plugin)
{
    bool correctParameters = true;
    for (int i = 1; i < ac_; i++) {
        SimpleString argument = av_[i];

        if      (argument == "-v") verbose_ = true;
        else if (argument == "-c") color_ = true;
        else if (argument == "-p") runTestsAsSeperateProcess_ = true;
        else if (argument == "-lg") listTestGroupNames_ = true;
        else if (argument == "-ln") listTestGroupAndCaseNames_ = true;
        else if (argument == "-ri") runIgnored_ = true;
        else if (argument.startsWith("-r")) SetRepeatCount(ac_, av_, i);
        else if (argument.startsWith("-g")) AddGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-sg")) AddStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xg")) AddExcludeGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-xsg")) AddExcludeStrictGroupFilter(ac_, av_, i);
        else if (argument.startsWith("-n")) AddNameFilter(ac_, av_, i);
        else if (argument.startsWith("-sn")) AddStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xn")) AddExcludeNameFilter(ac_, av_, i);
        else if (argument.startsWith("-xsn")) AddExcludeStrictNameFilter(ac_, av_, i);
        else if (argument.startsWith("TEST(")) AddTestToRunBasedOnVerboseOutput(ac_, av_, i, "TEST(");
        else if (argument.startsWith("IGNORE_TEST(")) AddTestToRunBasedOnVerboseOutput(ac_, av_, i, "IGNORE_TEST(");
        else if (argument.startsWith("-o")) correctParameters = SetOutputType(ac_, av_, i);
        else if (argument.startsWith("-p")) correctParameters = plugin->parseAllArguments(ac_, av_, i);
        else if (argument.startsWith("-k")) SetPackageName(ac_, av_, i);
        else correctParameters = false;

        if (correctParameters == false) {
            return false;
        }
    }
    return true;
}